

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

Mat * deleteBg(Mat *img,Mat *out,Ptr<cv::BackgroundSubtractor> *bgs,bool learn,int thresh_sens_val)

{
  BackgroundSubtractor *pBVar1;
  undefined7 in_register_00000009;
  int in_R9D;
  _InputArray local_1f8;
  _InputArray local_1e0;
  Mat local_1c8 [8];
  Mat res;
  _OutputArray local_168;
  _InputArray local_150;
  _OutputArray local_138;
  _InputArray local_110;
  byte local_f1;
  Mat local_f0 [8];
  Mat grayscale;
  Mat local_90 [8];
  Mat fgMask;
  int thresh_sens_val_local;
  bool learn_local;
  Ptr<cv::BackgroundSubtractor> *bgs_local;
  Mat *out_local;
  Mat *img_local;
  Mat *threshDiff;
  
  cv::Mat::Mat(local_90);
  cv::Mat::Mat(local_f0);
  local_f1 = 0;
  cv::Mat::Mat(img);
  pBVar1 = cv::Ptr<cv::BackgroundSubtractor>::operator->
                     ((Ptr<cv::BackgroundSubtractor> *)CONCAT71(in_register_00000009,learn));
  cv::_InputArray::_InputArray(&local_110,out);
  cv::_OutputArray::_OutputArray(&local_138,local_90);
  (**(code **)(*(long *)pBVar1 + 0x40))
            ((double)((byte)thresh_sens_val & 1),pBVar1,&local_110,&local_138);
  cv::_OutputArray::~_OutputArray(&local_138);
  cv::_InputArray::~_InputArray(&local_110);
  cv::_InputArray::_InputArray(&local_150,local_90);
  cv::_OutputArray::_OutputArray(&local_168,img);
  cv::threshold(&local_150,&local_168,(double)in_R9D,255.0,0);
  cv::_OutputArray::~_OutputArray(&local_168);
  cv::_InputArray::~_InputArray(&local_150);
  mask_morph(img);
  cv::Mat::Mat(local_1c8);
  cv::_OutputArray::_OutputArray((_OutputArray *)&local_1e0,local_1c8);
  cv::_InputArray::_InputArray(&local_1f8,img);
  cv::Mat::copyTo((_OutputArray *)out,&local_1e0);
  cv::_InputArray::~_InputArray(&local_1f8);
  cv::_OutputArray::~_OutputArray((_OutputArray *)&local_1e0);
  cv::Mat::operator=((Mat *)bgs,local_1c8);
  local_f1 = 1;
  cv::Mat::~Mat(local_1c8);
  if ((local_f1 & 1) == 0) {
    cv::Mat::~Mat(img);
  }
  cv::Mat::~Mat(local_f0);
  cv::Mat::~Mat(local_90);
  return img;
}

Assistant:

Mat deleteBg(Mat img, Mat &out, Ptr<BackgroundSubtractor> bgs, bool learn, int thresh_sens_val) {
    Mat fgMask, grayscale, threshDiff;
    bgs->apply(img, fgMask, learn);

    threshold(fgMask, threshDiff, thresh_sens_val, 255, THRESH_BINARY);
    mask_morph(threshDiff);

    Mat res;
    img.copyTo(res, threshDiff);
    out = res;

    return threshDiff;
}